

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O0

FString __thiscall OPLMIDIDevice::GetStats(OPLMIDIDevice *this)

{
  long in_RSI;
  uint local_20;
  char local_1c [4];
  uint i;
  char star [3];
  OPLMIDIDevice *this_local;
  FString *out;
  
  local_1c[3] = 0;
  FString::FString((FString *)this);
  local_1c[0] = '\x1c';
  local_1c[1] = 'A';
  local_1c[2] = 0x2a;
  for (local_20 = 0; local_20 < *(uint *)(*(long *)(in_RSI + 0x170) + 0x48); local_20 = local_20 + 1
      ) {
    if ((*(byte *)(in_RSI + (ulong)local_20 * 0x28 + 0x18a) & 0x80) == 0) {
      if ((*(byte *)(in_RSI + (ulong)local_20 * 0x28 + 0x18a) & 2) == 0) {
        if ((*(byte *)(in_RSI + (ulong)local_20 * 0x28 + 0x18a) & 1) == 0) {
          local_1c[1] = 0x44;
        }
        else {
          local_1c[1] = 0x48;
        }
      }
      else {
        local_1c[1] = 0x49;
      }
    }
    else {
      local_1c[1] = 0x41;
    }
    FString::AppendCStrPart((FString *)this,local_1c,3);
  }
  return (FString)(char *)this;
}

Assistant:

FString OPLMIDIDevice::GetStats()
{
	FString out;
	char star[3] = { TEXTCOLOR_ESCAPE, 'A', '*' };
	for (uint i = 0; i < io->OPLchannels; ++i)
	{
		if (channels[i].flags & CH_FREE)
		{
			star[1] = CR_BRICK + 'A';
		}
		else if (channels[i].flags & CH_SUSTAIN)
		{
			star[1] = CR_ORANGE + 'A';
		}
		else if (channels[i].flags & CH_SECONDARY)
		{
			star[1] = CR_BLUE + 'A';
		}
		else
		{
			star[1] = CR_GREEN + 'A';
		}
		out.AppendCStrPart (star, 3);
	}
	return out;
}